

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

bool anon_unknown.dwarf_16af90::checkPixels<float>
               (Array2D<unsigned_int> *sampleCount,Array2D<float_*> *ph,int lx,int rx,int ly,int ry,
               int width)

{
  uint *puVar1;
  float **ppfVar2;
  ostream *poVar3;
  void *pvVar4;
  int in_ECX;
  int in_EDX;
  Array2D<float_*> *in_RSI;
  Array2D<unsigned_int> *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar5;
  int in_stack_00000008;
  uint i;
  int x;
  int y;
  uint local_34;
  int local_30;
  int local_2c;
  
  local_2c = in_R8D;
  do {
    local_30 = in_EDX;
    if (in_R9D < local_2c) {
      return true;
    }
    for (; local_30 <= in_ECX; local_30 = local_30 + 1) {
      for (local_34 = 0; puVar1 = Imf_3_2::Array2D<unsigned_int>::operator[](in_RDI,(long)local_2c),
          local_34 < puVar1[local_30]; local_34 = local_34 + 1) {
        ppfVar2 = Imf_3_2::Array2D<float_*>::operator[](in_RSI,(long)local_2c);
        fVar5 = (float)((local_2c * in_stack_00000008 + local_30) % 0x801);
        if ((ppfVar2[local_30][local_34] != fVar5) ||
           (NAN(ppfVar2[local_30][local_34]) || NAN(fVar5))) {
          poVar3 = std::operator<<((ostream *)&std::cout,"value at ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2c);
          poVar3 = std::operator<<(poVar3,", sample ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_34);
          poVar3 = std::operator<<(poVar3,": ");
          ppfVar2 = Imf_3_2::Array2D<float_*>::operator[](in_RSI,(long)local_2c);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,ppfVar2[local_30][local_34]);
          poVar3 = std::operator<<(poVar3,", should be ");
          pvVar4 = (void *)std::ostream::operator<<
                                     (poVar3,(local_2c * in_stack_00000008 + local_30) % 0x801);
          pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
          return false;
        }
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount,
    Array2D<T*>&           ph,
    int                    lx,
    int                    rx,
    int                    ly,
    int                    ry,
    int                    width)
{
    for (int y = ly; y <= ry; ++y)
    {
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T> (((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i
                         << ": " << ph[y][x][i] << ", should be "
                         << (y * width + x) % 2049 << endl
                         << flush;
                    return false;
                }
            }
        }
    }

    return true;
}